

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTrace.cpp
# Opt level: O0

int __thiscall
llbuild::core::BuildEngineTrace::open(BuildEngineTrace *this,char *__file,int __oflag,...)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  int *piVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  FILE *local_30;
  FILE *fp;
  string *error_out_local;
  string *filename_local;
  BuildEngineTrace *this_local;
  
  fp = ___oflag;
  error_out_local = (string *)__file;
  filename_local = (string *)this;
  bVar1 = isOpen(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!isOpen()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngineTrace.cpp"
                  ,0x20,
                  "bool llbuild::core::BuildEngineTrace::open(const std::string &, std::string *)");
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  local_30 = fopen(pcVar3,"wb");
  if (local_30 == (FILE *)0x0) {
    std::operator+(&local_b0,"unable to open \'",error_out_local);
    std::operator+(&local_90,&local_b0,"\' (");
    piVar4 = __errno_location();
    pcVar3 = strerror(*piVar4);
    std::operator+(&local_70,&local_90,pcVar3);
    std::operator+(&local_50,&local_70,")");
    std::__cxx11::string::operator=((string *)fp,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    uVar5 = std::__cxx11::string::~string((string *)&local_b0);
    this_local._7_1_ = 0;
  }
  else {
    this->outputPtr = local_30;
    bVar1 = isOpen(this);
    if (!bVar1) {
      __assert_fail("isOpen()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngineTrace.cpp"
                    ,0x29,
                    "bool llbuild::core::BuildEngineTrace::open(const std::string &, std::string *)"
                   );
    }
    uVar2 = fprintf(local_30,"[\n");
    uVar5 = (ulong)uVar2;
    this_local._7_1_ = 1;
  }
  return (int)CONCAT71((int7)(uVar5 >> 8),this_local._7_1_);
}

Assistant:

bool BuildEngineTrace::open(const std::string& filename,
                            std::string* error_out) {
  assert(!isOpen());

  FILE *fp = fopen(filename.c_str(), "wb");
  if (!fp) {
    *error_out = "unable to open '" + filename + "' (" +
      ::strerror(errno) + ")";
    return false;
  }
  outputPtr = fp;
  assert(isOpen());

  // Write the opening header.
  fprintf(fp, "[\n");
  return true;
}